

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

void __thiscall leveldb::anon_unknown_1::PosixFileLock::~PosixFileLock(PosixFileLock *this)

{
  pointer pcVar1;
  
  (this->super_FileLock)._vptr_FileLock = (_func_int **)&PTR__PosixFileLock_0017ded8;
  pcVar1 = (this->filename_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->filename_).field_2) {
    operator_delete(pcVar1);
  }
  FileLock::~FileLock(&this->super_FileLock);
  operator_delete(this);
  return;
}

Assistant:

PosixFileLock(int fd, std::string filename)
      : fd_(fd), filename_(std::move(filename)) {}